

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint _h;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  float *pfVar10;
  int iVar11;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  void *pvVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ulong local_b0;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar11 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar11;
  }
  iVar11 = this->num_output;
  uVar2 = bottom_blob->w;
  _h = bottom_blob->h;
  uVar3 = bottom_blob->c;
  if ((bottom_blob->dims == 2) && (1 < (int)_h && uVar2 == this->weight_data_size / iVar11)) {
    Mat::create(top_blob,iVar11,_h,bottom_blob->elemsize,opt->blob_allocator);
    pvVar6 = top_blob->data;
    if (pvVar6 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    pvVar19 = bottom_blob->data;
    iVar11 = bottom_blob->w;
    iVar4 = top_blob->w;
    sVar7 = top_blob->elemsize;
    uVar3 = this->num_output;
    iVar5 = this->bias_term;
    pvVar8 = (this->weight_data).data;
    iVar16 = this->activation_type;
    sVar9 = bottom_blob->elemsize;
    local_b0 = 0;
    do {
      if (0 < (int)uVar3) {
        pfVar10 = (float *)(this->activation_params).data;
        pvVar13 = (this->bias_data).data;
        uVar15 = 0;
        pvVar14 = pvVar8;
        do {
          if (iVar5 == 0) {
            fVar22 = 0.0;
          }
          else {
            fVar22 = *(float *)((long)pvVar13 + uVar15 * 4);
          }
          if (0 < (int)uVar2) {
            uVar12 = 0;
            do {
              fVar22 = fVar22 + *(float *)((long)pvVar14 + uVar12 * 4) *
                                *(float *)((long)pvVar19 + uVar12 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar2 != uVar12);
          }
          fVar20 = fVar22;
          switch(iVar16) {
          case 1:
            if (fVar22 <= 0.0) {
              fVar20 = 0.0;
            }
            break;
          case 2:
            fVar20 = (float)(~-(uint)(0.0 < fVar22) & (uint)*pfVar10 |
                            -(uint)(0.0 < fVar22) & 0x3f800000) * fVar22;
            break;
          case 3:
            if (fVar22 <= *pfVar10) {
              fVar22 = *pfVar10;
            }
            fVar20 = fVar22;
            if (pfVar10[1] <= fVar22) {
              fVar20 = pfVar10[1];
            }
            break;
          case 4:
            fVar22 = expf(-fVar22);
            fVar20 = 1.0 / (fVar22 + 1.0);
            break;
          case 5:
            fVar20 = expf(fVar22);
            fVar20 = logf(fVar20 + 1.0);
            fVar20 = tanhf(fVar20);
            fVar20 = fVar20 * fVar22;
            break;
          case 6:
            fVar1 = *pfVar10;
            fVar21 = -pfVar10[1] / fVar1;
            fVar20 = 0.0;
            if ((fVar21 <= fVar22) && (fVar20 = fVar22, fVar22 <= fVar21 + 1.0 / fVar1)) {
              fVar20 = (fVar1 * fVar22 + pfVar10[1]) * fVar22;
            }
          }
          *(float *)((long)pvVar6 + uVar15 * 4 + (long)iVar4 * sVar7 * local_b0) = fVar20;
          uVar15 = uVar15 + 1;
          pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar2 * 4);
        } while (uVar15 != uVar3);
      }
      local_b0 = local_b0 + 1;
      pvVar19 = (void *)((long)pvVar19 + (long)iVar11 * sVar9);
    } while (local_b0 != _h);
  }
  else {
    Mat::create(top_blob,iVar11,bottom_blob->elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    iVar11 = this->num_output;
    if (0 < (long)iVar11) {
      uVar18 = _h * uVar2;
      iVar4 = this->bias_term;
      iVar5 = this->activation_type;
      pvVar6 = (this->bias_data).data;
      pvVar19 = (this->weight_data).data;
      pfVar10 = (float *)(this->activation_params).data;
      pvVar8 = top_blob->data;
      iVar16 = 0;
      lVar17 = 0;
      do {
        fVar22 = 0.0;
        if (iVar4 != 0) {
          fVar22 = *(float *)((long)pvVar6 + lVar17 * 4);
        }
        if (0 < (int)uVar3) {
          pvVar13 = (void *)((long)pvVar19 + (long)iVar16 * 4);
          pvVar14 = bottom_blob->data;
          uVar15 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar12 = 0;
              do {
                fVar22 = fVar22 + *(float *)((long)pvVar13 + uVar12 * 4) *
                                  *(float *)((long)pvVar14 + uVar12 * 4);
                uVar12 = uVar12 + 1;
              } while (uVar18 != uVar12);
            }
            uVar15 = uVar15 + 1;
            pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar18 * 4);
            pvVar14 = (void *)((long)pvVar14 + bottom_blob->cstep * bottom_blob->elemsize);
          } while (uVar15 != uVar3);
        }
        fVar20 = fVar22;
        switch(iVar5) {
        case 1:
          if (fVar22 <= 0.0) {
            fVar20 = 0.0;
          }
          break;
        case 2:
          fVar20 = (float)(~-(uint)(0.0 < fVar22) & (uint)*pfVar10 |
                          -(uint)(0.0 < fVar22) & 0x3f800000) * fVar22;
          break;
        case 3:
          if (fVar22 <= *pfVar10) {
            fVar22 = *pfVar10;
          }
          fVar20 = fVar22;
          if (pfVar10[1] <= fVar22) {
            fVar20 = pfVar10[1];
          }
          break;
        case 4:
          fVar22 = expf(-fVar22);
          fVar20 = 1.0 / (fVar22 + 1.0);
          break;
        case 5:
          fVar20 = expf(fVar22);
          fVar20 = logf(fVar20 + 1.0);
          fVar20 = tanhf(fVar20);
          fVar20 = fVar20 * fVar22;
          break;
        case 6:
          fVar1 = *pfVar10;
          fVar21 = -pfVar10[1] / fVar1;
          fVar20 = 0.0;
          if ((fVar21 <= fVar22) && (fVar20 = fVar22, fVar22 <= fVar21 + 1.0 / fVar1)) {
            fVar20 = (fVar1 * fVar22 + pfVar10[1]) * fVar22;
          }
        }
        *(float *)((long)pvVar8 + lVar17 * 4) = fVar20;
        lVar17 = lVar17 + 1;
        iVar16 = iVar16 + _h * uVar3 * uVar2;
      } while (lVar17 != iVar11);
    }
  }
  return 0;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* m = bottom_blob.row(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const float* kptr = (const float*)weight_data + w * p;

                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }

                outptr[p] = activation_ss(sum, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q = 0; q < channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        top_blob[p] = activation_ss(sum, activation_type, activation_params);
    }

    return 0;
}